

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O0

void __thiscall
bidirectional::BiDirectional::getMinimumWeights(BiDirectional *this,double *fwd_min,double *bwd_min)

{
  bool bVar1;
  pointer pSVar2;
  reference piVar3;
  pointer pDVar4;
  __shared_ptr *p_Var5;
  element_type *peVar6;
  double *in_RDX;
  double *in_RSI;
  _Rb_tree_const_iterator<int> *in_RDI;
  double dVar7;
  int *n_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1_1;
  int *n;
  iterator __end1;
  iterator __begin1;
  set<int,_std::less<int>,_std::allocator<int>_> *__range1;
  undefined4 in_stack_ffffffffffffff98;
  int iVar8;
  int in_stack_ffffffffffffff9c;
  _Self local_50;
  _Self local_48;
  set<int,_std::less<int>,_std::allocator<int>_> *local_40;
  int *local_38;
  _Self local_30;
  _Self local_28;
  set<int,_std::less<int>,_std::allocator<int>_> *local_20;
  double *local_18;
  double *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  dVar7 = std::numeric_limits<double>::infinity();
  *local_10 = dVar7;
  pSVar2 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
           operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                       *)0x247c7c);
  local_20 = &pSVar2->visited_vertices;
  local_28._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_30._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while (bVar1 = std::operator==(&local_28,&local_30), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_38 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)0x247cc7);
    in_stack_ffffffffffffff9c = *local_38;
    pDVar4 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
             operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                         *)0x247ce5);
    if (in_stack_ffffffffffffff9c != (pDVar4->source).lemon_id) {
      pSVar2 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
               operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                           *)0x247d06);
      p_Var5 = (__shared_ptr *)
               std::
               vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
               ::operator[](&pSVar2->best_labels,(long)*local_38);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var5);
      if (bVar1) {
        pSVar2 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                 ::operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               *)0x247d3f);
        std::
        vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
        ::operator[](&pSVar2->best_labels,(long)*local_38);
        peVar6 = std::
                 __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x247d5e);
        if (peVar6->weight < *local_10) {
          pSVar2 = std::
                   unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
                   operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               *)0x247d82);
          std::
          vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
          ::operator[](&pSVar2->best_labels,(long)*local_38);
          peVar6 = std::
                   __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x247da1);
          *local_10 = peVar6->weight;
        }
      }
    }
    std::_Rb_tree_const_iterator<int>::operator++(in_RDI);
  }
  dVar7 = std::numeric_limits<double>::infinity();
  *local_18 = dVar7;
  pSVar2 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
           operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                       *)0x247dde);
  local_40 = &pSVar2->visited_vertices;
  local_48._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_50._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while (bVar1 = std::operator==(&local_48,&local_50), ((bVar1 ^ 0xffU) & 1) != 0) {
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x247e29);
    iVar8 = *piVar3;
    pDVar4 = std::unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>::
             operator->((unique_ptr<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                         *)0x247e46);
    if (iVar8 != (pDVar4->sink).lemon_id) {
      pSVar2 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
               operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                           *)0x247e66);
      p_Var5 = (__shared_ptr *)
               std::
               vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
               ::operator[](&pSVar2->best_labels,(long)*piVar3);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(p_Var5);
      if (bVar1) {
        pSVar2 = std::unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                 ::operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               *)0x247e9f);
        std::
        vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
        ::operator[](&pSVar2->best_labels,(long)*piVar3);
        peVar6 = std::
                 __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x247ebe);
        if (peVar6->weight < *local_18) {
          pSVar2 = std::
                   unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>::
                   operator->((unique_ptr<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               *)0x247ee2);
          std::
          vector<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
          ::operator[](&pSVar2->best_labels,(long)*piVar3);
          peVar6 = std::
                   __shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<labelling::Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x247f01);
          *local_18 = peVar6->weight;
        }
      }
    }
    std::_Rb_tree_const_iterator<int>::operator++(in_RDI);
  }
  return;
}

Assistant:

void BiDirectional::getMinimumWeights(double* fwd_min, double* bwd_min) {
  // Forward
  // init
  *fwd_min = std::numeric_limits<double>::infinity();
  for (const int& n : fwd_search_ptr_->visited_vertices) {
    if (n != graph_ptr_->source.lemon_id && fwd_search_ptr_->best_labels[n] &&
        fwd_search_ptr_->best_labels[n]->weight < *fwd_min) {
      *fwd_min = fwd_search_ptr_->best_labels[n]->weight;
    }
  }
  // backward
  *bwd_min = std::numeric_limits<double>::infinity();
  for (const int& n : bwd_search_ptr_->visited_vertices) {
    if (n != graph_ptr_->sink.lemon_id && bwd_search_ptr_->best_labels[n] &&
        bwd_search_ptr_->best_labels[n]->weight < *bwd_min) {
      *bwd_min = bwd_search_ptr_->best_labels[n]->weight;
    }
  }
}